

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

void anon_unknown.dwarf_1082924::processOptions
               (cmGeneratorTarget *tgt,EvaluatedTargetPropertyEntries *entries,
               vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *options,unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *uniqueOptions,bool debugOptions,char *logName,OptionsParse parse,
               bool processDeviceOptions)

{
  cmListFileBacktrace *backtrace;
  pointer pEVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  pointer pbVar3;
  bool bVar4;
  cmake *this;
  string *__rhs;
  pointer pEVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__v;
  undefined3 in_register_00000081;
  string *o;
  pointer __args;
  basic_string_view<char,_std::char_traits<char>_> __y;
  basic_string_view<char,_std::char_traits<char>_> __y_00;
  basic_string_view<char,_std::char_traits<char>_> __y_01;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_00;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_01;
  string_view str;
  __ireturn_type _Var6;
  bool local_15f;
  allocator<char> local_15e;
  allocator<char> local_15d;
  undefined4 local_15c;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tmp;
  string usedOptions;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_15c = CONCAT31(in_register_00000081,debugOptions);
  local_15f = !processDeviceOptions;
  pEVar5 = (entries->Entries).
           super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pEVar1 = (entries->Entries).
           super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (pEVar5 == pEVar1) {
      return;
    }
    usedOptions._M_dataplus._M_p = (pointer)&usedOptions.field_2;
    usedOptions._M_string_length = 0;
    usedOptions.field_2._M_local_buf[0] = '\0';
    pbVar2 = (pEVar5->Values).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    backtrace = &pEVar5->Backtrace;
    for (__v = (pEVar5->Values).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start; __v != pbVar2; __v = __v + 1) {
      if (processDeviceOptions) {
        __y._M_str = DAT_008b91b0;
        __y._M_len = (anonymous_namespace)::DL_BEGIN;
        __x._M_str = (__v->_M_dataplus)._M_p;
        __x._M_len = __v->_M_string_length;
        bVar4 = std::operator==(__x,__y);
        if (!bVar4) {
          __y_00._M_str = DAT_008b91c0;
          __y_00._M_len = (anonymous_namespace)::DL_END;
          __x_00._M_str = (__v->_M_dataplus)._M_p;
          __x_00._M_len = __v->_M_string_length;
          bVar4 = std::operator==(__x_00,__y_00);
          if (!bVar4) goto LAB_0033f801;
        }
        std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
        emplace_back<std::__cxx11::string_const&,cmListFileBacktrace_const&>
                  ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)
                   options,__v,backtrace);
        __y_01._M_str = DAT_008b91b0;
        __y_01._M_len = (anonymous_namespace)::DL_BEGIN;
        __x_01._M_str = (__v->_M_dataplus)._M_p;
        __x_01._M_len = __v->_M_string_length;
        local_15f = std::operator==(__x_01,__y_01);
      }
      else {
LAB_0033f801:
        _Var6 = std::__detail::
                _Insert_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                ::insert((_Insert_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                          *)uniqueOptions,__v);
        if (((undefined1  [16])_Var6 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          if (parse == Shell) {
            str._M_str = (__v->_M_dataplus)._M_p;
            str._M_len = __v->_M_string_length;
            bVar4 = cmHasLiteralPrefix<7ul>(str,(char (*) [7])"SHELL:");
            if (!bVar4) goto LAB_0033f88b;
            if (local_15f == false) {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&tmp,(__v->_M_dataplus)._M_p + 6,(allocator<char> *)&local_f0);
              std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
              emplace_back<std::__cxx11::string,cmListFileBacktrace_const&>
                        ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>
                          *)options,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tmp,
                         backtrace);
              std::__cxx11::string::~string((string *)&tmp);
            }
            else {
              tmp.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              tmp.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              tmp.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              cmSystemTools::ParseUnixCommandLine((__v->_M_dataplus)._M_p + 6,&tmp);
              pbVar3 = tmp.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
              for (__args = tmp.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start; __args != pbVar3;
                  __args = __args + 1) {
                std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
                emplace_back<std::__cxx11::string,cmListFileBacktrace_const&>
                          ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>
                            *)options,__args,backtrace);
              }
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector(&tmp);
            }
          }
          else {
LAB_0033f88b:
            std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
            emplace_back<std::__cxx11::string_const&,cmListFileBacktrace_const&>
                      ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)
                       options,__v,backtrace);
          }
          if ((char)local_15c != '\0') {
            std::operator+(&local_f0," * ",__v);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tmp
                           ,&local_f0,"\n");
            std::__cxx11::string::append((string *)&usedOptions);
            std::__cxx11::string::~string((string *)&tmp);
            std::__cxx11::string::~string((string *)&local_f0);
          }
        }
      }
    }
    if (usedOptions._M_string_length != 0) {
      this = cmLocalGenerator::GetCMakeInstance(tgt->LocalGenerator);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"Used ",&local_15d);
      std::operator+(&local_d0,&local_70,logName);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_90," for target ",&local_15e);
      std::operator+(&local_b0,&local_d0,&local_90);
      __rhs = cmGeneratorTarget::GetName_abi_cxx11_(tgt);
      std::operator+(&local_50,&local_b0,__rhs);
      std::operator+(&local_f0,&local_50,":\n");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tmp,
                     &local_f0,&usedOptions);
      cmake::IssueMessage(this,LOG,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&tmp,backtrace);
      std::__cxx11::string::~string((string *)&tmp);
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_70);
    }
    std::__cxx11::string::~string((string *)&usedOptions);
    pEVar5 = pEVar5 + 1;
  } while( true );
}

Assistant:

void processOptions(cmGeneratorTarget const* tgt,
                    EvaluatedTargetPropertyEntries const& entries,
                    std::vector<BT<std::string>>& options,
                    std::unordered_set<std::string>& uniqueOptions,
                    bool debugOptions, const char* logName, OptionsParse parse,
                    bool processDeviceOptions = false)
{
  bool splitOption = !processDeviceOptions;
  for (EvaluatedTargetPropertyEntry const& entry : entries.Entries) {
    std::string usedOptions;
    for (std::string const& opt : entry.Values) {
      if (processDeviceOptions && (opt == DL_BEGIN || opt == DL_END)) {
        options.emplace_back(opt, entry.Backtrace);
        splitOption = opt == DL_BEGIN;
        continue;
      }

      if (uniqueOptions.insert(opt).second) {
        if (parse == OptionsParse::Shell &&
            cmHasLiteralPrefix(opt, "SHELL:")) {
          if (splitOption) {
            std::vector<std::string> tmp;
            cmSystemTools::ParseUnixCommandLine(opt.c_str() + 6, tmp);
            for (std::string& o : tmp) {
              options.emplace_back(std::move(o), entry.Backtrace);
            }
          } else {
            options.emplace_back(std::string(opt.c_str() + 6),
                                 entry.Backtrace);
          }
        } else {
          options.emplace_back(opt, entry.Backtrace);
        }
        if (debugOptions) {
          usedOptions += " * " + opt + "\n";
        }
      }
    }
    if (!usedOptions.empty()) {
      tgt->GetLocalGenerator()->GetCMakeInstance()->IssueMessage(
        MessageType::LOG,
        std::string("Used ") + logName + std::string(" for target ") +
          tgt->GetName() + ":\n" + usedOptions,
        entry.Backtrace);
    }
  }
}